

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void float_invalid_op_vxvc(CPUPPCState_conflict *env,_Bool set_fpcc,uintptr_t retaddr)

{
  uint uVar1;
  undefined3 in_register_00000031;
  
  uVar1 = env->fpscr & 0xfffe0fff | 0x91000;
  if (CONCAT31(in_register_00000031,set_fpcc) == 0) {
    uVar1 = env->fpscr | 0x80000;
  }
  env->fpscr = uVar1 | 0xa0000000;
  if ((char)uVar1 < '\0') {
    *(undefined4 *)&env[-1].spr_cb[0x3be].uea_write = 6;
    env->error_code = 0x1a;
    env->fpscr = uVar1 | 0xe0000000;
  }
  return;
}

Assistant:

static void float_invalid_op_vxvc(CPUPPCState *env, bool set_fpcc,
                                  uintptr_t retaddr)
{
    env->fpscr |= FP_VXVC;
    if (set_fpcc) {
        env->fpscr &= ~FP_FPCC;
        env->fpscr |= (FP_C | FP_FU);
    }
    /* Update the floating-point invalid operation summary */
    env->fpscr |= FP_VX;
    /* Update the floating-point exception summary */
    env->fpscr |= FP_FX;
    /* We must update the target FPR before raising the exception */
    if (fpscr_ve != 0) {
        CPUState *cs = env_cpu(env);

        cs->exception_index = POWERPC_EXCP_PROGRAM;
        env->error_code = POWERPC_EXCP_FP | POWERPC_EXCP_FP_VXVC;
        /* Update the floating-point enabled exception summary */
        env->fpscr |= FP_FEX;
        /* Exception is deferred */
    }
}